

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermSubstitutionTree.hpp
# Opt level: O0

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>
 __thiscall
Indexing::TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::getUnifications
          (TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *this,TypedTermList t,
          bool retrieveSubstitutions)

{
  TypedTermList query;
  SortId in_RDX;
  TermList in_RSI;
  IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>
  *in_RDI;
  undefined1 in_R8B;
  bool in_stack_ffffffffffffffd7;
  undefined7 in_stack_ffffffffffffffd8;
  
  query._sort._content = in_RDX._content;
  query.super_TermList._content = in_RSI._content;
  getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>>
            ((TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *)
             (CONCAT17(in_R8B,in_stack_ffffffffffffffd8) & 0x1ffffffffffffff),query,
             in_stack_ffffffffffffffd7);
  Lib::
  pvi<Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::Demodulation::Lhs>>>>
            ((IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>_>
              *)in_RDX._content);
  Lib::
  IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>_>
  ::~IterTraits((IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>_>
                 *)0x37041b);
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>
          )in_RDI;
}

Assistant:

VirtualIterator<QueryRes<ResultSubstitutionSP, LeafData>> getUnifications(TypedTermList t, bool retrieveSubstitutions) override
  { return pvi(getResultIterator<typename SubstitutionTree::template Iterator<RetrievalAlgorithms::RobUnification<RetrievalAlgorithms::DefaultVarBanks>>>(t, retrieveSubstitutions)); }